

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void BailOutRecord::ScheduleFunctionCodeGen
               (ScriptFunction *function,ScriptFunction *innerMostInlinee,
               BailOutRecord *bailOutRecord,BailOutKind bailOutKind,uint32 actualBailOutOffset,
               ImplicitCallFlags savedImplicitCallFlags,void *returnAddress)

{
  ushort uVar1;
  code *pcVar2;
  anon_class_16_2_b7ce67e3 fn;
  undefined4 uVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  uint8 uVar7;
  ImplicitCallFlags IVar8;
  BYTE BVar9;
  BYTE BVar10;
  ExecutionMode EVar11;
  uint uVar12;
  LocalFunctionId LVar13;
  BailOutKind BVar14;
  int iVar15;
  uint32 uVar16;
  ScriptContext *pSVar17;
  ThreadContext *this;
  undefined4 *puVar18;
  FunctionBody *pFVar19;
  undefined4 extraout_var;
  char *pcVar20;
  FunctionEntryPointInfo *entryPointInfo_00;
  JavascriptMethod entryPoint;
  NativeCodeGenerator *nativeCodeGen;
  undefined4 extraout_var_00;
  char16 *pcVar21;
  char *pcVar22;
  char16_t *pcVar23;
  RejitReason local_248;
  RejitReason local_245;
  RejitReason local_219;
  DynamicProfileInfo *local_1c0;
  uint local_198;
  bool local_179;
  wchar local_168 [4];
  char16 debugStringBuffer_1 [42];
  FunctionEntryPointInfo *defaultEntryPointInfo;
  uint local_100 [2];
  uint val;
  BailOutKind local_f4;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_f0;
  BailoutStatsMap *bailoutReasonCountsCap;
  ScriptContext *scriptContext_1;
  ScriptContext *scriptContext;
  char16 debugStringBuffer [42];
  uint32 state;
  DynamicProfileInfo *profileInfo;
  bool reThunk;
  RejitReason rejitReason;
  bool *pbStack_70;
  uint8 callsCount;
  FunctionEntryPointInfo **local_68;
  bool local_5d [8];
  bool foundEntryPoint;
  FunctionEntryPointInfo *local_50;
  FunctionEntryPointInfo *entryPointInfo;
  BailOutRecord *bailOutRecordNotConst;
  AutoPushReturnAddressForStackWalker saveReturnAddress;
  FunctionBody *executeFunction;
  ImplicitCallFlags savedImplicitCallFlags_local;
  uint32 actualBailOutOffset_local;
  BailOutKind bailOutKind_local;
  BailOutRecord *bailOutRecord_local;
  ScriptFunction *innerMostInlinee_local;
  ScriptFunction *function_local;
  
  if (bailOutKind == BailOnSimpleJitToFullJitLoopBody) {
    return;
  }
  if (bailOutKind == BailOutForGeneratorYield) {
    return;
  }
  if (bailOutKind == LazyBailOut) {
    return;
  }
  saveReturnAddress.m_scriptContext =
       (ScriptContext *)Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  uVar12 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)saveReturnAddress.m_scriptContext)
  ;
  LVar13 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)saveReturnAddress.m_scriptContext)
  ;
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ReJITPhase,uVar12,LVar13);
  if (bVar5) {
    return;
  }
  pSVar17 = Js::FunctionProxy::GetScriptContext(saveReturnAddress.m_scriptContext);
  Js::AutoPushReturnAddressForStackWalker::AutoPushReturnAddressForStackWalker
            ((AutoPushReturnAddressForStackWalker *)&bailOutRecordNotConst,pSVar17,returnAddress);
  bailOutRecord->bailOutCount = bailOutRecord->bailOutCount + 1;
  entryPointInfo = (FunctionEntryPointInfo *)bailOutRecord;
  local_50 = GetFunctionEntryPointInfo(bailOutRecord);
  local_5d[0] = false;
  pbStack_70 = local_5d;
  local_68 = &local_50;
  fn.entryPointInfo = local_68;
  fn.foundEntryPoint = pbStack_70;
  Js::FunctionBody::
  MapEntryPointsUntil<BailOutRecord::ScheduleFunctionCodeGen(Js::ScriptFunction*,Js::ScriptFunction*,BailOutRecord_const*,IR::BailOutKind,unsigned_int,Js::ImplicitCallFlags,void*)::__0>
            ((FunctionBody *)saveReturnAddress.m_scriptContext,fn);
  local_179 = true;
  if ((local_5d[0] & 1U) == 0) {
    pSVar17 = Js::RecyclableObject::GetScriptContext((RecyclableObject *)function);
    this = Js::ScriptContext::GetThreadContext(pSVar17);
    local_179 = ThreadContext::IsOldEntryPointInfo(this,(ProxyEntryPointInfo *)local_50);
  }
  local_5d[0] = local_179;
  if (local_179 == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x752,"(foundEntryPoint)","foundEntryPoint");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 0;
  }
  if (local_50->callsCount < 0x100) {
    local_198 = local_50->callsCount & 0xff;
  }
  else {
    local_198 = 0xff;
  }
  profileInfo._7_1_ = (byte)local_198;
  profileInfo._6_1_ = None;
  profileInfo._5_1_ = 0;
  bVar6 = Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout();
  cVar4 = profileInfo._7_1_;
  if (bVar6 < local_198) {
    uVar7 = Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout();
    profileInfo._7_1_ = cVar4 - uVar7;
  }
  else {
    profileInfo._7_1_ = 0;
  }
  CheckPreemptiveRejit
            ((FunctionBody *)saveReturnAddress.m_scriptContext,bailOutKind,
             (BailOutRecord *)entryPointInfo,(uint8 *)((long)&profileInfo + 7),-1);
  local_50->callsCount = (uint)profileInfo._7_1_;
  if (bailOutKind == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x75f,"(bailOutKind != IR::BailOutInvalid)",
                       "bailOutKind != IR::BailOutInvalid");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 0;
  }
  bVar5 = Js::FunctionBody::HasDynamicProfileInfo((FunctionBody *)saveReturnAddress.m_scriptContext)
  ;
  if (bVar5) {
    local_1c0 = Js::FunctionBody::GetAnyDynamicProfileInfo
                          ((FunctionBody *)saveReturnAddress.m_scriptContext);
  }
  else {
    local_1c0 = (DynamicProfileInfo *)0x0;
  }
  stack0xffffffffffffff80 = local_1c0;
  if ((local_1c0 == (DynamicProfileInfo *)0x0) || (profileInfo._7_1_ != 0)) {
    uVar12 = Js::FunctionProxy::GetSourceContextId
                       ((FunctionProxy *)saveReturnAddress.m_scriptContext);
    LVar13 = Js::FunctionProxy::GetLocalFunctionId
                       ((FunctionProxy *)saveReturnAddress.m_scriptContext);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,ReJITPhase,uVar12,LVar13);
    if (!bVar5) goto LAB_005078ce;
  }
  BVar14 = IR::operator|(BailOutOnResultConditions,BailOutOnDivSrcConditions);
  BVar14 = IR::operator&(bailOutKind,BVar14);
  if ((((BVar14 == BailOutInvalid) && (bailOutKind != BailOutIntOnly)) &&
      (bailOutKind != BailOnIntMin)) && (bailOutKind != BailOnDivResultNotInt)) {
    BVar14 = IR::operator&(bailOutKind,BailOutForDebuggerBits);
    if (BVar14 == BailOutInvalid) {
      if (bailOutKind - BailOutNumberOnly < 2) {
        bVar5 = Js::DynamicProfileInfo::IsFloatTypeSpecDisabled(stack0xffffffffffffff80);
        if (bVar5) {
          profileInfo._5_1_ = 1;
        }
        else {
          Js::DynamicProfileInfo::DisableFloatTypeSpec(stack0xffffffffffffff80);
          profileInfo._6_1_ = FloatTypeSpecDisabled;
        }
      }
      else if (bailOutKind - BailOutOnImplicitCalls < 2) {
        IVar8 = Js::FunctionBody::GetSavedImplicitCallsFlags
                          ((FunctionBody *)saveReturnAddress.m_scriptContext);
        if ((IVar8 & savedImplicitCallFlags) == ImplicitCall_None) {
          Js::DynamicProfileInfo::RecordImplicitCallFlags
                    (stack0xffffffffffffff80,savedImplicitCallFlags);
          Js::DynamicProfileInfo::DisableLoopImplicitCallInfo(stack0xffffffffffffff80);
          profileInfo._6_1_ = ImplicitCallFlagsChanged;
        }
        else {
          profileInfo._5_1_ = 1;
        }
      }
      else if (bailOutKind == BailOutOnNotPrimitive) {
        bVar5 = Js::DynamicProfileInfo::IsLossyIntTypeSpecDisabled(stack0xffffffffffffff80);
        if (bVar5) {
          profileInfo._5_1_ = 1;
        }
        else {
          Js::DynamicProfileInfo::DisableLossyIntTypeSpec(stack0xffffffffffffff80);
          profileInfo._6_1_ = LossyIntTypeSpecDisabled;
        }
      }
      else if (bailOutKind == BailOutOnMemOpError) {
        bVar5 = Js::DynamicProfileInfo::IsMemOpDisabled(stack0xffffffffffffff80);
        if (bVar5) {
          profileInfo._5_1_ = 1;
        }
        else {
          Js::DynamicProfileInfo::DisableMemOp(stack0xffffffffffffff80);
          profileInfo._6_1_ = MemOpDisabled;
        }
      }
      else if (bailOutKind == BailOutOnInlineFunction) {
LAB_0050749a:
        if (innerMostInlinee == (ScriptFunction *)0x0) {
          BVar9 = Js::FunctionBody::GetSavedInlinerVersion
                            ((FunctionBody *)saveReturnAddress.m_scriptContext);
          BVar10 = Js::DynamicProfileInfo::GetInlinerVersion(stack0xffffffffffffff80);
          if (BVar9 == BVar10) {
            profileInfo._5_1_ = 1;
          }
          else {
            profileInfo._6_1_ = InlineeChanged;
          }
        }
        else {
          profileInfo._6_1_ = InlineeChanged;
        }
      }
      else if (bailOutKind == BailOutOnNoProfile) {
        bVar5 = Js::DynamicProfileInfo::IsNoProfileBailoutsDisabled(stack0xffffffffffffff80);
        if (bVar5) {
          profileInfo._5_1_ = 1;
        }
        else {
          bVar6 = Js::FunctionBody::IncrementBailOnMisingProfileRejitCount
                            ((FunctionBody *)saveReturnAddress.m_scriptContext);
          if (DAT_01e9e25c < bVar6) {
            Js::DynamicProfileInfo::DisableNoProfileBailouts(stack0xffffffffffffff80);
          }
          else {
            Js::FunctionBody::ResetBailOnMisingProfileCount
                      ((FunctionBody *)saveReturnAddress.m_scriptContext);
          }
          profileInfo._6_1_ = NoProfile;
        }
      }
      else {
        if (bailOutKind == BailOutOnPolymorphicInlineFunction) goto LAB_0050749a;
        if (bailOutKind == BailOutOnFailedPolymorphicInlineTypeCheck) {
          profileInfo._6_1_ = FailedPolymorphicInlineeTypeCheck;
        }
        else if (bailOutKind == BailOutOnNotArray) {
          bVar5 = Js::DynamicProfileInfo::IsArrayCheckHoistDisabled(stack0xffffffffffffff80,false);
          if (bVar5) {
            profileInfo._5_1_ = 1;
          }
          else {
            Js::DynamicProfileInfo::DisableArrayCheckHoist(stack0xffffffffffffff80,false);
            profileInfo._6_1_ = ArrayCheckHoistDisabled;
          }
        }
        else if (bailOutKind == BailOutOnNotNativeArray) {
          iVar15 = Js::DynamicProfileInfo::GetRejitCount(stack0xffffffffffffff80);
          if (iVar15 < 0x32) {
            profileInfo._6_1_ = ExpectingNativeArray;
          }
          else {
            profileInfo._5_1_ = 1;
          }
        }
        else if (bailOutKind == BailOutConventionalTypedArrayAccessOnly) {
          bVar5 = Js::DynamicProfileInfo::IsTypedArrayTypeSpecDisabled
                            (stack0xffffffffffffff80,false);
          if (bVar5) {
            profileInfo._5_1_ = 1;
          }
          else {
            Js::DynamicProfileInfo::DisableTypedArrayTypeSpec(stack0xffffffffffffff80,false);
            profileInfo._6_1_ = TypedArrayTypeSpecDisabled;
          }
        }
        else if (bailOutKind == BailOutOnIrregularLength) {
          bVar5 = Js::DynamicProfileInfo::IsLdLenIntSpecDisabled(stack0xffffffffffffff80);
          if (bVar5) {
            profileInfo._5_1_ = 1;
          }
          else {
            Js::DynamicProfileInfo::DisableLdLenIntSpec(stack0xffffffffffffff80);
            profileInfo._6_1_ = LdLenIntSpecDisabled;
          }
        }
        else if (bailOutKind == BailOutCheckThis) {
          bVar5 = Js::DynamicProfileInfo::IsCheckThisDisabled(stack0xffffffffffffff80);
          if (bVar5) {
            profileInfo._5_1_ = 1;
          }
          else {
            Js::DynamicProfileInfo::DisableCheckThis(stack0xffffffffffffff80);
            profileInfo._6_1_ = CheckThisDisabled;
          }
        }
        else if (bailOutKind == BailOutOnTaggedValue) {
          bVar5 = Js::DynamicProfileInfo::IsTagCheckDisabled(stack0xffffffffffffff80);
          if (bVar5) {
            profileInfo._5_1_ = 1;
          }
          else {
            Js::DynamicProfileInfo::DisableTagCheck(stack0xffffffffffffff80);
            profileInfo._6_1_ = FailedTagCheck;
          }
        }
        else if (bailOutKind == BailOutFailedTypeCheck) {
LAB_005075da:
          if (innerMostInlinee == (ScriptFunction *)0x0) {
            debugStringBuffer._76_4_ =
                 Js::DynamicProfileInfo::GetPolymorphicCacheState(stack0xffffffffffffff80);
            uVar12 = Js::FunctionProxy::GetSourceContextId
                               ((FunctionProxy *)saveReturnAddress.m_scriptContext);
            LVar13 = Js::FunctionProxy::GetLocalFunctionId
                               ((FunctionProxy *)saveReturnAddress.m_scriptContext);
            bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar12,LVar13);
            if (bVar5) {
              pcVar21 = Js::FunctionProxy::GetDebugNumberSet
                                  ((FunctionProxy *)saveReturnAddress.m_scriptContext,
                                   (wchar (*) [42])&scriptContext);
              uVar16 = Js::FunctionBody::GetSavedPolymorphicCacheState
                                 ((FunctionBody *)saveReturnAddress.m_scriptContext);
              Output::Print(L"Objtypespec (%s): States on bailout: Saved cache: %d, Live cache: %d\n"
                            ,pcVar21,(ulong)uVar16,(ulong)(uint)debugStringBuffer._76_4_);
              Output::Flush();
            }
            uVar3 = debugStringBuffer._76_4_;
            uVar16 = Js::FunctionBody::GetSavedPolymorphicCacheState
                               ((FunctionBody *)saveReturnAddress.m_scriptContext);
            if (uVar16 < (uint)uVar3) {
              local_245 = FailedTypeCheck;
              if (bailOutKind != BailOutFailedTypeCheck) {
                local_245 = FailedFixedFieldTypeCheck;
              }
              profileInfo._6_1_ = local_245;
            }
            else {
              profileInfo._5_1_ = 1;
            }
          }
          else {
            local_219 = FailedTypeCheck;
            if (bailOutKind != BailOutFailedTypeCheck) {
              local_219 = FailedFixedFieldTypeCheck;
            }
            profileInfo._6_1_ = local_219;
          }
        }
        else if (bailOutKind == BailOutFailedEquivalentTypeCheck) {
LAB_0050773e:
          bVar5 = Js::DynamicProfileInfo::IsEquivalentObjTypeSpecDisabled(stack0xffffffffffffff80);
          if (bVar5) {
            profileInfo._5_1_ = 1;
          }
          else {
            local_248 = FailedEquivalentTypeCheck;
            if (bailOutKind != BailOutFailedEquivalentTypeCheck) {
              local_248 = FailedEquivalentFixedFieldTypeCheck;
            }
            profileInfo._6_1_ = local_248;
          }
        }
        else if (bailOutKind == BailOutExpectingInteger) {
          bVar5 = Js::DynamicProfileInfo::IsSwitchOptDisabled(stack0xffffffffffffff80);
          if (bVar5) {
            profileInfo._5_1_ = 1;
          }
          else {
            Js::DynamicProfileInfo::DisableSwitchOpt(stack0xffffffffffffff80);
            profileInfo._6_1_ = DisableSwitchOptExpectingInteger;
          }
        }
        else if (bailOutKind == BailOutExpectingString) {
          bVar5 = Js::DynamicProfileInfo::IsSwitchOptDisabled(stack0xffffffffffffff80);
          if (bVar5) {
            profileInfo._5_1_ = 1;
          }
          else {
            Js::DynamicProfileInfo::DisableSwitchOpt(stack0xffffffffffffff80);
            profileInfo._6_1_ = DisableSwitchOptExpectingString;
          }
        }
        else {
          if (bailOutKind == BailOutFailedInlineTypeCheck) goto LAB_0050749a;
          if (bailOutKind == BailOutFailedFixedFieldTypeCheck) goto LAB_005075da;
          if (bailOutKind == BailOutFailedFixedFieldCheck) {
            profileInfo._6_1_ = FailedFixedFieldCheck;
          }
          else {
            if (bailOutKind == BailOutFailedEquivalentFixedFieldTypeCheck) goto LAB_0050773e;
            if (bailOutKind == BailOutOnFloor) {
              bVar5 = Js::DynamicProfileInfo::IsFloorInliningDisabled(stack0xffffffffffffff80);
              if (bVar5) {
                profileInfo._5_1_ = 1;
              }
              else {
                Js::DynamicProfileInfo::DisableFloorInlining(stack0xffffffffffffff80);
                profileInfo._6_1_ = FloorInliningDisabled;
              }
            }
            else if (bailOutKind == BailOnModByPowerOf2) {
              profileInfo._6_1_ = ModByPowerOf2;
            }
            else if (bailOutKind == BailOutFailedCtorGuardCheck) {
              profileInfo._6_1_ = CtorGuardInvalidated;
            }
            else if (bailOutKind == BailOutOnFailedHoistedBoundCheck) {
              bVar5 = Js::DynamicProfileInfo::IsBoundCheckHoistDisabled
                                (stack0xffffffffffffff80,false);
              if (bVar5) {
                profileInfo._5_1_ = 1;
              }
              else {
                Js::DynamicProfileInfo::DisableBoundCheckHoist(stack0xffffffffffffff80,false);
                profileInfo._6_1_ = BoundCheckHoistDisabled;
              }
            }
            else if (bailOutKind == BailOutOnFailedHoistedLoopCountBasedBoundCheck) {
              bVar5 = Js::DynamicProfileInfo::IsLoopCountBasedBoundCheckHoistDisabled
                                (stack0xffffffffffffff80,false);
              if (bVar5) {
                profileInfo._5_1_ = 1;
              }
              else {
                Js::DynamicProfileInfo::DisableLoopCountBasedBoundCheckHoist
                          (stack0xffffffffffffff80,false);
                profileInfo._6_1_ = LoopCountBasedBoundCheckHoistDisabled;
              }
            }
            else if (bailOutKind == BailOutOnEarlyExit) {
              bVar5 = Js::DynamicProfileInfo::IsOptimizeTryFinallyDisabled(stack0xffffffffffffff80);
              if (bVar5) {
                profileInfo._5_1_ = 1;
              }
              else {
                Js::DynamicProfileInfo::DisableOptimizeTryFinally(stack0xffffffffffffff80);
                profileInfo._6_1_ = OptimizeTryFinallyDisabled;
              }
            }
            else if (bailOutKind == BailOutOnPowIntIntOverflow) {
              bVar5 = Js::DynamicProfileInfo::IsPowIntIntTypeSpecDisabled(stack0xffffffffffffff80);
              if (bVar5) {
                profileInfo._5_1_ = 1;
              }
              else {
                Js::DynamicProfileInfo::DisablePowIntIntTypeSpec(stack0xffffffffffffff80);
                profileInfo._6_1_ = PowIntIntTypeSpecDisabled;
              }
            }
            else if (bailOutKind == BailOutOnMissingValue) {
              bVar5 = Js::DynamicProfileInfo::IsArrayMissingValueCheckHoistDisabled
                                (stack0xffffffffffffff80,false);
              if (bVar5) {
                profileInfo._5_1_ = 1;
              }
              else {
                Js::DynamicProfileInfo::DisableArrayMissingValueCheckHoist
                          (stack0xffffffffffffff80,false);
                profileInfo._6_1_ = ArrayMissingValueCheckHoistDisabled;
              }
            }
            else if (bailOutKind == BailOutConventionalNativeArrayAccessOnly) {
              profileInfo._6_1_ = ExpectingConventionalNativeArrayAccess;
            }
            else if (bailOutKind == BailOutConvertedNativeArray) {
              profileInfo._6_1_ = ConvertedNativeArray;
            }
            else if (bailOutKind == BailOutOnArrayAccessHelperCall) {
              profileInfo._6_1_ = ArrayAccessNeededHelperCall;
            }
            else if (bailOutKind == BailOutOnInvalidatedArrayHeadSegment) {
              bVar5 = Js::DynamicProfileInfo::IsJsArraySegmentHoistDisabled
                                (stack0xffffffffffffff80,false);
              if (bVar5) {
                profileInfo._5_1_ = 1;
              }
              else {
                Js::DynamicProfileInfo::DisableJsArraySegmentHoist(stack0xffffffffffffff80,false);
                profileInfo._6_1_ = JsArraySegmentHoistDisabled;
              }
            }
            else if (bailOutKind == BailOnStackArgsOutOfActualsRange) {
              bVar5 = Js::DynamicProfileInfo::IsStackArgOptDisabled(stack0xffffffffffffff80);
              if (bVar5) {
                profileInfo._5_1_ = 1;
              }
              else {
                Js::DynamicProfileInfo::DisableStackArgOpt(stack0xffffffffffffff80);
                profileInfo._6_1_ = DisableStackArgOpt;
              }
            }
          }
        }
      }
    }
  }
  else {
    BVar14 = IR::operator&(bailOutKind,BailOutOnMulOverflow);
    if (BVar14 == BailOutInvalid) {
      BVar14 = IR::operator|(BailOutOnDivByZero,BailOutOnDivOfMinInt);
      BVar14 = IR::operator&(bailOutKind,BVar14);
      if ((BVar14 == BailOutInvalid) && (bailOutKind != BailOnDivResultNotInt)) {
        bVar5 = Js::DynamicProfileInfo::IsAggressiveIntTypeSpecDisabled
                          (stack0xffffffffffffff80,false);
        if (bVar5) {
          profileInfo._5_1_ = 1;
        }
        else {
          Js::DynamicProfileInfo::DisableAggressiveIntTypeSpec(stack0xffffffffffffff80,false);
          profileInfo._6_1_ = AggressiveIntTypeSpecDisabled;
        }
      }
      else {
        bVar5 = Js::DynamicProfileInfo::IsDivIntTypeSpecDisabled(stack0xffffffffffffff80,false);
        if (bVar5) {
          profileInfo._5_1_ = 1;
        }
        else {
          Js::DynamicProfileInfo::DisableDivIntTypeSpec(stack0xffffffffffffff80,false);
          profileInfo._6_1_ = DivIntTypeSpecDisabled;
        }
      }
    }
    else {
      bVar5 = Js::DynamicProfileInfo::IsAggressiveMulIntTypeSpecDisabled
                        (stack0xffffffffffffff80,false);
      if (bVar5) {
        profileInfo._5_1_ = 1;
      }
      else {
        Js::DynamicProfileInfo::DisableAggressiveMulIntTypeSpec(stack0xffffffffffffff80,false);
        profileInfo._6_1_ = AggressiveMulIntTypeSpecDisabled;
      }
    }
  }
  if ((profileInfo._6_1_ != None) && ((profileInfo._5_1_ & 1) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x915,"(!(rejitReason != RejitReason::None && reThunk))",
                       "!(rejitReason != RejitReason::None && reThunk)");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar18 = 0;
  }
LAB_005078ce:
  uVar12 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)saveReturnAddress.m_scriptContext)
  ;
  LVar13 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)saveReturnAddress.m_scriptContext)
  ;
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,ReJITPhase,uVar12,LVar13);
  if ((bVar5) && (profileInfo._6_1_ == None)) {
    profileInfo._6_1_ = Forced;
  }
  if (((profileInfo._5_1_ & 1) == 0) && (profileInfo._6_1_ != None)) {
    iVar15 = Js::DynamicProfileInfo::GetRejitCount(stack0xffffffffffffff80);
    if ((99 < iVar15) ||
       ((uVar16 = Js::DynamicProfileInfo::GetBailOutOffsetForLastRejit(stack0xffffffffffffff80),
        uVar16 == actualBailOutOffset &&
        (bVar5 = Js::ScriptFunction::IsNewEntryPointAvailable(function), bVar5)))) {
      scriptContext_1 = Js::FunctionProxy::GetScriptContext(saveReturnAddress.m_scriptContext);
      if (scriptContext_1->rejitReasonCountsCap != (uint *)0x0) {
        scriptContext_1->rejitReasonCountsCap[profileInfo._6_1_] =
             scriptContext_1->rejitReasonCountsCap[profileInfo._6_1_] + 1;
      }
      profileInfo._5_1_ = 1;
      profileInfo._6_1_ = None;
    }
    else {
      Js::DynamicProfileInfo::IncRejitCount(stack0xffffffffffffff80);
      Js::DynamicProfileInfo::SetBailOutOffsetForLastRejit
                (stack0xffffffffffffff80,actualBailOutOffset);
    }
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,ReJITPhase);
  if ((bVar5) &&
     ((bVar5 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca300), bVar5 ||
      (bVar5 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca300,bailOutKind), bVar5)))) {
    pFVar19 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
    iVar15 = (*(pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    pcVar22 = GetBailOutKindName(bailOutKind);
    bVar6 = profileInfo._7_1_;
    uVar1 = bailOutRecord->bailOutCount;
    pcVar20 = GetRejitReasonName(profileInfo._6_1_);
    pcVar23 = L"false";
    if ((profileInfo._5_1_ & 1) != 0) {
      pcVar23 = L"true";
    }
    Output::Print(L"Bailout from function: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d, reJitReason: %S, reThunk: %s\r\n"
                  ,CONCAT44(extraout_var,iVar15),pcVar22,(ulong)uVar1,(ulong)bVar6,pcVar20,pcVar23);
    Output::Flush();
  }
  pSVar17 = Js::FunctionProxy::GetScriptContext(saveReturnAddress.m_scriptContext);
  Js::ScriptContext::LogBailout
            (pSVar17,(FunctionBody *)saveReturnAddress.m_scriptContext,bailOutKind);
  if (500 < bailOutRecord->bailOutCount) {
    bailoutReasonCountsCap =
         (BailoutStatsMap *)
         Js::FunctionProxy::GetScriptContext((FunctionProxy *)saveReturnAddress.m_scriptContext);
    local_f0 = ((ScriptContext *)bailoutReasonCountsCap)->bailoutReasonCountsCap;
    if (local_f0 !=
        (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      local_f4 = bailOutKind;
      bVar5 = JsUtil::
              BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(local_f0,&local_f4);
      if (((bVar5 ^ 0xffU) & 1) == 0) {
        defaultEntryPointInfo._4_4_ = bailOutKind;
        local_100[0] = JsUtil::
                       BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ::Item(local_f0,(uint *)((long)&defaultEntryPointInfo + 4));
        local_100[0] = local_100[0] + 1;
        defaultEntryPointInfo._0_4_ = bailOutKind;
        JsUtil::
        BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Item(local_f0,(uint *)&defaultEntryPointInfo,local_100);
      }
      else {
        local_100[1] = 1;
        val = bailOutKind;
        JsUtil::
        BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Item(local_f0,&val,local_100 + 1);
      }
    }
  }
  if (((profileInfo._5_1_ & 1) != 0) &&
     (bVar5 = Js::FunctionBody::DontRethunkAfterBailout
                        ((FunctionBody *)saveReturnAddress.m_scriptContext), bVar5)) {
    profileInfo._5_1_ = 0;
    profileInfo._6_1_ = AfterLoopBodyRejit;
  }
  if ((profileInfo._5_1_ & 1) == 0) {
    if (profileInfo._6_1_ != None) {
      bVar5 = IsForLoopTop(bailOutRecord);
      if ((bVar5) && (bVar5 = IR::IsTypeCheckBailOutKind(bailOutRecord->bailOutKind), bVar5)) {
        Js::DynamicProfileInfo::DisableFieldPRE(stack0xffffffffffffff80);
      }
      pSVar17 = Js::FunctionProxy::GetScriptContext(saveReturnAddress.m_scriptContext);
      Js::ScriptContext::LogRejit
                (pSVar17,(FunctionBody *)saveReturnAddress.m_scriptContext,profileInfo._6_1_);
      Js::FunctionBody::ClearDontRethunkAfterBailout
                ((FunctionBody *)saveReturnAddress.m_scriptContext);
      pSVar17 = Js::FunctionProxy::GetScriptContext(saveReturnAddress.m_scriptContext);
      nativeCodeGen = Js::ScriptContext::GetNativeCodeGenerator(pSVar17);
      GenerateFunction(nativeCodeGen,(FunctionBody *)saveReturnAddress.m_scriptContext,function);
      EVar11 = Js::FunctionBody::GetExecutionMode((FunctionBody *)saveReturnAddress.m_scriptContext)
      ;
      if (EVar11 != FullJit) {
        Js::FunctionBody::TraceExecutionMode
                  ((FunctionBody *)saveReturnAddress.m_scriptContext,"Rejit (before)");
        Js::FunctionBody::TransitionToFullJitExecutionMode
                  ((FunctionBody *)saveReturnAddress.m_scriptContext);
        Js::FunctionBody::TraceExecutionMode
                  ((FunctionBody *)saveReturnAddress.m_scriptContext,"Rejit");
      }
      uVar12 = Js::FunctionProxy::GetSourceContextId
                         ((FunctionProxy *)saveReturnAddress.m_scriptContext);
      LVar13 = Js::FunctionProxy::GetLocalFunctionId
                         ((FunctionProxy *)saveReturnAddress.m_scriptContext);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ReJITPhase,uVar12,LVar13);
      if (bVar5) {
        iVar15 = (*((saveReturnAddress.m_scriptContext)->super_ScriptContextInfo).
                   _vptr_ScriptContextInfo[7])();
        pcVar21 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)saveReturnAddress.m_scriptContext,
                             (wchar (*) [42])local_168);
        Output::Print(L"Rejit: function: %s (%s), bailOutCount: %hu",
                      CONCAT44(extraout_var_00,iVar15),pcVar21,(ulong)bailOutRecord->bailOutCount);
        Output::Print(L" callCount: %u",(ulong)profileInfo._7_1_);
        pcVar22 = GetRejitReasonName(profileInfo._6_1_);
        Output::Print(L" reason: %S",pcVar22);
        if (bailOutKind != BailOutInvalid) {
          pcVar22 = GetBailOutKindName(bailOutKind);
          Output::Print(L" (%S)",pcVar22);
        }
        Output::Print(L"\n");
        Output::Flush();
      }
    }
  }
  else {
    entryPointInfo_00 =
         Js::FunctionBody::GetDefaultFunctionEntryPointInfo
                   ((FunctionBody *)saveReturnAddress.m_scriptContext);
    unique0x10000f21 = entryPointInfo_00;
    entryPoint = Js::FunctionProxy::GetDirectEntryPoint
                           ((FunctionProxy *)saveReturnAddress.m_scriptContext,
                            (ProxyEntryPointInfo *)entryPointInfo_00);
    Js::ScriptFunction::UpdateThunkEntryPoint(function,entryPointInfo_00,entryPoint);
  }
  Js::AutoPushReturnAddressForStackWalker::~AutoPushReturnAddressForStackWalker
            ((AutoPushReturnAddressForStackWalker *)&bailOutRecordNotConst);
  return;
}

Assistant:

void BailOutRecord::ScheduleFunctionCodeGen(Js::ScriptFunction * function, Js::ScriptFunction * innerMostInlinee,
    BailOutRecord const * bailOutRecord, IR::BailOutKind bailOutKind, uint32 actualBailOutOffset, Js::ImplicitCallFlags savedImplicitCallFlags, void * returnAddress)
{
    if (bailOutKind == IR::BailOnSimpleJitToFullJitLoopBody ||
        bailOutKind == IR::BailOutForGeneratorYield ||
        bailOutKind == IR::LazyBailOut)
    {
        return;
    }

    Js::FunctionBody * executeFunction = function->GetFunctionBody();

    if (PHASE_OFF(Js::ReJITPhase, executeFunction))
    {
        return;
    }

    Js::AutoPushReturnAddressForStackWalker saveReturnAddress(executeFunction->GetScriptContext(), returnAddress);

    BailOutRecord * bailOutRecordNotConst = (BailOutRecord *)(void *)bailOutRecord;
    bailOutRecordNotConst->bailOutCount++;

    Js::FunctionEntryPointInfo *entryPointInfo = bailOutRecord->GetFunctionEntryPointInfo();

#if DBG
    // BailOutRecord is not recycler-allocated, so make sure something the recycler can see was keeping the entry point info alive.
    // We expect the entry point to be kept alive as follows:
    // 1. The function's current type might still have the same entry point info as when we entered the function (easy case)
    // 2. The function might have moved to a successor path type, which still keeps the previous type and its entry point info alive
    // 3. The entry point info might be held by the ThreadContext (QueueFreeOldEntryPointInfoIfInScript):
    //   a. If the entry point info was replaced on the type that used to hold it (ScriptFunction::ChangeEntryPoint)
    //   b. If the function's last-added property was deleted and it moved to a previous type (ScriptFunction::ReplaceTypeWithPredecessorType)
    //   c. If the function's path type got replaced with a dictionary, then all previous entry point infos in that path are queued on the ThreadContext (ScriptFunction::PrepareForConversionToNonPathType)
    bool foundEntryPoint = false;
    executeFunction->MapEntryPointsUntil([&](int index, Js::FunctionEntryPointInfo* info)
    {
        foundEntryPoint = info == entryPointInfo;
        return foundEntryPoint;
    });
    foundEntryPoint = foundEntryPoint || function->GetScriptContext()->GetThreadContext()->IsOldEntryPointInfo(entryPointInfo);
    Assert(foundEntryPoint);
#endif

    uint8 callsCount = entryPointInfo->callsCount > 255 ? 255 : static_cast<uint8>(entryPointInfo->callsCount);
    RejitReason rejitReason = RejitReason::None;
    bool reThunk = false;

    callsCount = callsCount <= Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout() ? 0 : callsCount - Js::FunctionEntryPointInfo::GetDecrCallCountPerBailout() ;

    CheckPreemptiveRejit(executeFunction, bailOutKind, bailOutRecordNotConst, callsCount, -1);

    entryPointInfo->callsCount = callsCount;

    Assert(bailOutKind != IR::BailOutInvalid);

    Js::DynamicProfileInfo * profileInfo = executeFunction->HasDynamicProfileInfo() ? executeFunction->GetAnyDynamicProfileInfo() : nullptr;
    if ((profileInfo && callsCount == 0) ||
        PHASE_FORCE(Js::ReJITPhase, executeFunction))
    {
        if ((bailOutKind & (IR::BailOutOnResultConditions | IR::BailOutOnDivSrcConditions)) || bailOutKind == IR::BailOutIntOnly || bailOutKind == IR::BailOnIntMin || bailOutKind == IR::BailOnDivResultNotInt)
        {
            // Note WRT BailOnIntMin: it wouldn't make sense to re-jit without changing anything here, as interpreter will not change the (int) type,
            // so the options are: (1) rejit with disabling int type spec, (2) don't rejit, always bailout.
            // It seems to be better to rejit.
            if (bailOutKind & IR::BailOutOnMulOverflow)
            {
                if (profileInfo->IsAggressiveMulIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableAggressiveMulIntTypeSpec(false);
                    rejitReason = RejitReason::AggressiveMulIntTypeSpecDisabled;
                }
            }
            else if ((bailOutKind & (IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt)) || bailOutKind == IR::BailOnDivResultNotInt)
            {
                if (profileInfo->IsDivIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableDivIntTypeSpec(false);
                    rejitReason = RejitReason::DivIntTypeSpecDisabled;
                }
            }
            else
            {
                if (profileInfo->IsAggressiveIntTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableAggressiveIntTypeSpec(false);
                    rejitReason = RejitReason::AggressiveIntTypeSpecDisabled;
                }
            }
        }
        else if (bailOutKind & IR::BailOutForDebuggerBits)
        {
            // Do not rejit, do not rethunk, just ignore the bailout.
        }
        else switch(bailOutKind)
        {
            case IR::BailOutOnNotPrimitive:
                if (profileInfo->IsLossyIntTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLossyIntTypeSpec();
                    rejitReason = RejitReason::LossyIntTypeSpecDisabled;
                }
                break;
            case IR::BailOutOnMemOpError:
                if (profileInfo->IsMemOpDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableMemOp();
                    rejitReason = RejitReason::MemOpDisabled;
                }
                break;

            case IR::BailOutPrimitiveButString:
            case IR::BailOutNumberOnly:
                if (profileInfo->IsFloatTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableFloatTypeSpec();
                    rejitReason = RejitReason::FloatTypeSpecDisabled;
                }
                break;

            case IR::BailOutOnImplicitCalls:
            case IR::BailOutOnImplicitCallsPreOp:
                // Check if the implicit call flags in the profile have changed since we last JITed this
                // function body. If so, and they indicate an implicit call of some sort occurred
                // then we need to reJIT.
                if ((executeFunction->GetSavedImplicitCallsFlags() & savedImplicitCallFlags) == Js::ImplicitCall_None)
                {
                    profileInfo->RecordImplicitCallFlags(savedImplicitCallFlags);
                    profileInfo->DisableLoopImplicitCallInfo();
                    rejitReason = RejitReason::ImplicitCallFlagsChanged;
                }
                else
                {
                    reThunk = true;
                }
                break;

            case IR::BailOnModByPowerOf2:
                rejitReason = RejitReason::ModByPowerOf2;
                break;

            case IR::BailOutOnNotArray:
                if(profileInfo->IsArrayCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableArrayCheckHoist(false);
                    rejitReason = RejitReason::ArrayCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnNotNativeArray:

                // REVIEW: We have an issue with array profile info.  The info on the type of array we have won't
                //         get fixed by rejitting.  For now, just give up after 50 rejits.
                if (profileInfo->GetRejitCount() >= 50)
                {
                    reThunk = true;
                }
                else
                {
                    rejitReason = RejitReason::ExpectingNativeArray;
                }
                break;

            case IR::BailOutConvertedNativeArray:
                rejitReason = RejitReason::ConvertedNativeArray;
                break;

            case IR::BailOutConventionalTypedArrayAccessOnly:
                if(profileInfo->IsTypedArrayTypeSpecDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableTypedArrayTypeSpec(false);
                    rejitReason = RejitReason::TypedArrayTypeSpecDisabled;
                }
                break;

            case IR::BailOutConventionalNativeArrayAccessOnly:
                rejitReason = RejitReason::ExpectingConventionalNativeArrayAccess;
                break;

            case IR::BailOutOnMissingValue:
                if(profileInfo->IsArrayMissingValueCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableArrayMissingValueCheckHoist(false);
                    rejitReason = RejitReason::ArrayMissingValueCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnArrayAccessHelperCall:
                // This is a pre-op bailout, so the interpreter will update the profile data for this byte-code instruction to
                // prevent excessive bailouts here in the future
                rejitReason = RejitReason::ArrayAccessNeededHelperCall;
                break;

            case IR::BailOutOnInvalidatedArrayHeadSegment:
                if(profileInfo->IsJsArraySegmentHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableJsArraySegmentHoist(false);
                    rejitReason = RejitReason::JsArraySegmentHoistDisabled;
                }
                break;

            case IR::BailOutOnIrregularLength:
                if(profileInfo->IsLdLenIntSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLdLenIntSpec();
                    rejitReason = RejitReason::LdLenIntSpecDisabled;
                }
                break;

            case IR::BailOutOnFailedHoistedBoundCheck:
                if(profileInfo->IsBoundCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableBoundCheckHoist(false);
                    rejitReason = RejitReason::BoundCheckHoistDisabled;
                }
                break;

            case IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck:
                if(profileInfo->IsLoopCountBasedBoundCheckHoistDisabled(false))
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableLoopCountBasedBoundCheckHoist(false);
                    rejitReason = RejitReason::LoopCountBasedBoundCheckHoistDisabled;
                }
                break;

            case IR::BailOutExpectingInteger:
                if (profileInfo->IsSwitchOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableSwitchOpt();
                    rejitReason = RejitReason::DisableSwitchOptExpectingInteger;
                }
                break;

            case IR::BailOutExpectingString:
                if (profileInfo->IsSwitchOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableSwitchOpt();
                    rejitReason = RejitReason::DisableSwitchOptExpectingString;
                }
                break;

            case IR::BailOutOnFailedPolymorphicInlineTypeCheck:
                rejitReason = RejitReason::FailedPolymorphicInlineeTypeCheck;
                break;

            case IR::BailOnStackArgsOutOfActualsRange:
                if (profileInfo->IsStackArgOptDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableStackArgOpt();
                    rejitReason = RejitReason::DisableStackArgOpt;
                }
                break;
            case IR::BailOutOnPolymorphicInlineFunction:
            case IR::BailOutFailedInlineTypeCheck:
            case IR::BailOutOnInlineFunction:
                // Check if the inliner state has changed since we last JITed this function body. If so
                // then we need to reJIT.
                if (innerMostInlinee)
                {
                    // There is no way now to check if the inlinee version has changed. Just rejit.
                    // This should be changed to getting the inliner version corresponding to inlinee.
                    rejitReason = RejitReason::InlineeChanged;
                }
                else
                {
                    if (executeFunction->GetSavedInlinerVersion() == profileInfo->GetInlinerVersion())
                    {
                        reThunk = true;
                    }
                    else
                    {
                        rejitReason = RejitReason::InlineeChanged;
                    }
                }
                break;

            case IR::BailOutOnNoProfile:
                if (profileInfo->IsNoProfileBailoutsDisabled())
                {
                    reThunk = true;
                }
                else if (executeFunction->IncrementBailOnMisingProfileRejitCount() >  (uint)CONFIG_FLAG(BailOnNoProfileRejitLimit))
                {
                    profileInfo->DisableNoProfileBailouts();
                    rejitReason = RejitReason::NoProfile;
                }
                else
                {
                    executeFunction->ResetBailOnMisingProfileCount();
                    rejitReason = RejitReason::NoProfile;
                }
                break;

            case IR::BailOutCheckThis:
                // Presumably we've started passing a different "this" pointer to callees.
                if (profileInfo->IsCheckThisDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableCheckThis();
                    rejitReason = RejitReason::CheckThisDisabled;
                }
                break;

            case IR::BailOutOnTaggedValue:
                if (profileInfo->IsTagCheckDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableTagCheck();
                    rejitReason = RejitReason::FailedTagCheck;
                }
                break;

            case IR::BailOutFailedTypeCheck:
            case IR::BailOutFailedFixedFieldTypeCheck:
            {
                // An inline cache must have gone from monomorphic to polymorphic.
                // This is already noted in the profile data, so optimization of the given ld/st will
                // be inhibited on re-jit.
                // Consider disabling the optimization across the function after n failed type checks.
                if (innerMostInlinee)
                {
                    rejitReason = bailOutKind == IR::BailOutFailedTypeCheck ? RejitReason::FailedTypeCheck : RejitReason::FailedFixedFieldTypeCheck;
                }
                else
                {
                    uint32 state;
                    state = profileInfo->GetPolymorphicCacheState();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                    if (PHASE_TRACE(Js::ObjTypeSpecPhase, executeFunction))
                    {
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                        Output::Print(
                            _u("Objtypespec (%s): States on bailout: Saved cache: %d, Live cache: %d\n"),
                            executeFunction->GetDebugNumberSet(debugStringBuffer), executeFunction->GetSavedPolymorphicCacheState(), state);
                        Output::Flush();
                    }
#endif
                    if (state <= executeFunction->GetSavedPolymorphicCacheState())
                    {
                        reThunk = true;
                    }
                    else
                    {
                        rejitReason = bailOutKind == IR::BailOutFailedTypeCheck ?
                            RejitReason::FailedTypeCheck : RejitReason::FailedFixedFieldTypeCheck;
                    }
                }
                break;
            }

            case IR::BailOutFailedEquivalentTypeCheck:
            case IR::BailOutFailedEquivalentFixedFieldTypeCheck:
                if (profileInfo->IsEquivalentObjTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    rejitReason = bailOutKind == IR::BailOutFailedEquivalentTypeCheck ?
                        RejitReason::FailedEquivalentTypeCheck : RejitReason::FailedEquivalentFixedFieldTypeCheck;
                }
                break;

            case IR::BailOutFailedFixedFieldCheck:
                rejitReason = RejitReason::FailedFixedFieldCheck;
                break;

            case IR::BailOutFailedCtorGuardCheck:
                // (ObjTypeSpec): Consider scheduling re-JIT right after the first bailout.  We will never successfully execute the
                // function from which we just bailed out, unless we take a different code path through it.

                // A constructor cache guard may be invalidated for one of two reasons:
                // a) the constructor's prototype property has changed, or
                // b) one of the properties protected by the guard (this constructor cache served as) has changed in some way (e.g. became read-only).
                // In the former case, the cache itself will be marked as polymorphic and on re-JIT we won't do the optimization.
                // In the latter case, the inline cache for the offending property will be cleared and on re-JIT the guard will not be enlisted
                // to protect that property operation.
                rejitReason = RejitReason::CtorGuardInvalidated;
                break;

            case IR::BailOutOnFloor:
            {
                if (profileInfo->IsFloorInliningDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableFloorInlining();
                    rejitReason = RejitReason::FloorInliningDisabled;
                }
                break;
            }
            case IR::BailOutOnPowIntIntOverflow:
            {
                if (profileInfo->IsPowIntIntTypeSpecDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisablePowIntIntTypeSpec();
                    rejitReason = RejitReason::PowIntIntTypeSpecDisabled;
                }
                break;
            }
            case IR::BailOutOnEarlyExit:
            {
                if (profileInfo->IsOptimizeTryFinallyDisabled())
                {
                    reThunk = true;
                }
                else
                {
                    profileInfo->DisableOptimizeTryFinally();
                    rejitReason = RejitReason::OptimizeTryFinallyDisabled;
                }
                break;
            }
        }

        Assert(!(rejitReason != RejitReason::None && reThunk));
    }

    if(PHASE_FORCE(Js::ReJITPhase, executeFunction) && rejitReason == RejitReason::None)
    {
        rejitReason = RejitReason::Forced;
    }

    if (!reThunk && rejitReason != RejitReason::None)
    {
        // REVIEW: Temporary fix for RS1.  Disable Rejiting if it looks like it is not fixing the problem.
        //         For RS2, turn the rejitCount check into an assert and let's fix all these issues.
        if (profileInfo->GetRejitCount() >= 100 ||
            (profileInfo->GetBailOutOffsetForLastRejit() == actualBailOutOffset && function->IsNewEntryPointAvailable()))
        {
#ifdef REJIT_STATS
            Js::ScriptContext* scriptContext = executeFunction->GetScriptContext();
            if (scriptContext->rejitReasonCountsCap != nullptr)
            {
                scriptContext->rejitReasonCountsCap[static_cast<byte>(rejitReason)]++;
            }
#endif
            reThunk = true;
            rejitReason = RejitReason::None;
        }
        else
        {
            profileInfo->IncRejitCount();
            profileInfo->SetBailOutOffsetForLastRejit(actualBailOutOffset);
        }
    }

    REJIT_KIND_TESTTRACE(bailOutKind, _u("Bailout from function: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d, reJitReason: %S, reThunk: %s\r\n"),
        function->GetFunctionBody()->GetDisplayName(), ::GetBailOutKindName(bailOutKind), bailOutRecord->bailOutCount, callsCount,
        GetRejitReasonName(rejitReason), reThunk ? trueString : falseString);

    JS_ETW(EventWriteJSCRIPT_BACKEND_BAILOUT(function->GetFunctionBody()->GetLocalFunctionId(),
        function->GetFunctionBody()->GetSourceContextId(), function->GetFunctionBody()->GetDisplayName(), bailOutKind, bailOutRecord->bailOutCount, callsCount,
        GetRejitReasonName(rejitReason), reThunk));

#ifdef REJIT_STATS
    executeFunction->GetScriptContext()->LogBailout(executeFunction, bailOutKind);
    if (bailOutRecord->bailOutCount > 500)
    {
        Js::ScriptContext* scriptContext = executeFunction->GetScriptContext();
        auto bailoutReasonCountsCap = scriptContext->bailoutReasonCountsCap;
        if (bailoutReasonCountsCap != nullptr)
        {
            if (!bailoutReasonCountsCap->ContainsKey(bailOutKind))
            {
                bailoutReasonCountsCap->Item(bailOutKind, 1);
            }
            else
            {
                uint val = bailoutReasonCountsCap->Item(bailOutKind);
                ++val;
                bailoutReasonCountsCap->Item(bailOutKind, val);
            }
        }
    }
#endif

    if (reThunk && executeFunction->DontRethunkAfterBailout())
    {
        // This function is marked for rethunking, but the last ReJIT we've done was for a JIT loop body
        // So the latest rejitted version of this function may not have the right optimization disabled.
        // Rejit just to be safe.
        reThunk = false;
        rejitReason = RejitReason::AfterLoopBodyRejit;
    }
    if (reThunk)
    {
        Js::FunctionEntryPointInfo *const defaultEntryPointInfo = executeFunction->GetDefaultFunctionEntryPointInfo();
        function->UpdateThunkEntryPoint(defaultEntryPointInfo, executeFunction->GetDirectEntryPoint(defaultEntryPointInfo));
    }
    else if (rejitReason != RejitReason::None)
    {
        if (bailOutRecord->IsForLoopTop() && IR::IsTypeCheckBailOutKind(bailOutRecord->bailOutKind))
        {
            // Disable FieldPRE if we're triggering a type check rejit due to a bailout at the loop top.
            // Most likely this was caused by a CheckFixedFld that was hoisted from a branch block where
            // only certain types flowed, to the loop top, where more types (different or non-equivalent)
            // were flowing in.
            profileInfo->DisableFieldPRE();
        }
#ifdef REJIT_STATS
        executeFunction->GetScriptContext()->LogRejit(executeFunction, rejitReason);
#endif
        executeFunction->ClearDontRethunkAfterBailout();

        GenerateFunction(executeFunction->GetScriptContext()->GetNativeCodeGenerator(), executeFunction, function);

        if(executeFunction->GetExecutionMode() != ExecutionMode::FullJit)
        {
            // With expiry, it's possible that the execution mode is currently interpreter or simple JIT. Transition to full JIT
            // after successfully scheduling the rejit work item (in case of OOM).
            executeFunction->TraceExecutionMode("Rejit (before)");
            executeFunction->TransitionToFullJitExecutionMode();
            executeFunction->TraceExecutionMode("Rejit");
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if(PHASE_TRACE(Js::ReJITPhase, executeFunction))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(
                _u("Rejit: function: %s (%s), bailOutCount: %hu"),
                executeFunction->GetDisplayName(),
                executeFunction->GetDebugNumberSet(debugStringBuffer),
                bailOutRecord->bailOutCount);

            Output::Print(_u(" callCount: %u"), callsCount);
            Output::Print(_u(" reason: %S"), GetRejitReasonName(rejitReason));
            if(bailOutKind != IR::BailOutInvalid)
            {
                Output::Print(_u(" (%S)"), ::GetBailOutKindName(bailOutKind));
            }
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }
}